

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.cpp
# Opt level: O1

int __thiscall
sc_core::sc_phash_base::remove_by_contents(sc_phash_base *this,void *c,_func_void_void_ptr *kfree)

{
  sc_phash_elem *psVar1;
  sc_phash_elem **ppsVar2;
  int iVar3;
  sc_phash_elem *p;
  long lVar4;
  
  if (this->num_bins < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      p = this->bins[lVar4];
      if (p != (sc_phash_elem *)0x0) {
        ppsVar2 = this->bins + lVar4;
        do {
          psVar1 = p->next;
          if (p->contents == c) {
            *ppsVar2 = psVar1;
            (*kfree)(p->key);
            sc_mempool::release(p,0x18);
            psVar1 = *ppsVar2;
            this->num_entries = this->num_entries + -1;
            iVar3 = iVar3 + 1;
          }
          else {
            ppsVar2 = &p->next;
          }
          p = psVar1;
        } while (psVar1 != (sc_phash_elem *)0x0);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->num_bins);
  }
  return iVar3;
}

Assistant:

int
sc_phash_base::remove_by_contents( const void* c, void (*kfree)(void*) )
{
    sc_phash_elem** last;
    sc_phash_elem*  ptr;

    int num_removed = 0;
    for (int i = 0; i < num_bins; ++i) {
        last = &(bins[i]);
        ptr = *last;
        while (ptr != 0) {
            if (ptr->contents != c) {
                last = &(ptr->next);
                ptr  = *last;
            }
            else {
                *last = ptr->next;
                (*kfree)(ptr->key);
                delete ptr;
                ptr = *last;
                --num_entries;
                ++num_removed;
            }
        }
    }
    return num_removed;
}